

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SOIL.c
# Opt level: O2

uint SOIL_direct_load_DDS_from_memory
               (uchar *buffer,int buffer_length,uint reuse_texture_ID,int flags,
               int loading_as_cubemap)

{
  undefined1 uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  void *__ptr;
  ulong uVar7;
  uint uVar8;
  int iVar9;
  undefined8 uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  byte bVar14;
  int iVar15;
  ulong uVar16;
  undefined4 uVar17;
  uint tex_ID;
  uint local_9c;
  uint local_98;
  int local_94;
  ulong local_90;
  ulong local_88;
  ulong local_80;
  ulong local_78;
  ulong local_70;
  uint local_64;
  undefined4 local_60;
  uint local_5c;
  uint local_58;
  uint local_54;
  ulong local_50;
  undefined8 local_48;
  ulong local_40;
  uchar *local_38;
  ulong uVar6;
  
  tex_ID = 0;
  if (buffer == (uchar *)0x0) {
    result_string_pointer = "NULL buffer";
  }
  else if ((uint)buffer_length < 0x80) {
    result_string_pointer = "DDS file was too small to contain the DDS header";
  }
  else {
    local_78 = (ulong)*(uint *)(buffer + 0xc);
    local_80 = (ulong)*(uint *)(buffer + 0x10);
    uVar8 = *(uint *)(buffer + 0x1c);
    uVar3 = *(uint *)(buffer + 0x50);
    uVar13 = *(uint *)(buffer + 0x54);
    uVar11 = *(uint *)(buffer + 0x6c);
    uVar4 = *(uint *)(buffer + 0x70);
    result_string_pointer = "Failed to read a known DDS header";
    if (*(int *)buffer != 0x20534444) {
      return 0;
    }
    if (*(int *)(buffer + 4) != 0x7c) {
      return 0;
    }
    if ((*(uint *)(buffer + 8) & 0x1007) != 0x1007) {
      return 0;
    }
    if (((uVar11 >> 0xc & 1) == 0 || (uVar3 & 0x44) == 0) || *(int *)(buffer + 0x4c) != 0x20) {
      return 0;
    }
    local_98 = uVar3 & 4;
    if (((local_98 != 0) && (uVar13 != 0x35545844)) && ((uVar13 & 0xfdffffff) != 0x31545844)) {
      return 0;
    }
    result_string_pointer = "DDS header loaded and validated";
    local_64 = buffer_length;
    local_38 = buffer;
    if (local_98 == 0) {
      local_9c = (uVar3 & 1) + 3;
      local_88 = (ulong)((uVar3 & 1) + 0x1907);
      uVar3 = *(uint *)(buffer + 0x10) * *(uint *)(buffer + 0xc) * local_9c;
    }
    else {
      local_90 = CONCAT44(local_90._4_4_,reuse_texture_ID);
      iVar15 = query_DXT_capability();
      if (iVar15 != 1) {
        result_string_pointer = "Direct upload of S3TC images not supported by the OpenGL driver";
        return 0;
      }
      bVar14 = (char)(uVar13 >> 0x18) - 0x31;
      if (bVar14 < 5) {
        lVar5 = (ulong)bVar14 * 4;
        local_9c = *(uint *)(&DAT_001914dc + lVar5);
        local_88 = (ulong)*(uint *)(&DAT_001914f0 + lVar5);
      }
      else {
        local_88 = 0;
        local_9c = 0x10;
      }
      uVar3 = ((int)local_78 + 3U >> 2) * ((int)local_80 + 3U >> 2) * local_9c;
      reuse_texture_ID = (uint)local_90;
    }
    uVar13 = local_64;
    local_70 = (ulong)uVar3;
    if ((uVar4 >> 9 & 1) == 0) {
      if (loading_as_cubemap == 0) {
        uVar3 = 0xde1;
        uVar10 = 0xde1;
        uVar17 = 0xde1;
LAB_00156bc8:
        uVar2 = local_9c;
        local_90 = CONCAT44(local_90._4_4_,reuse_texture_ID);
        local_94 = 0;
        uVar4 = (uint)local_70;
        if ((1 < uVar8 & (byte)(uVar11 >> 0x16)) == 1) {
          local_94 = uVar8 - 1;
          uVar8 = local_98 >> 1;
          uVar6 = local_70;
          iVar15 = 0;
          if (0 < local_94) {
            iVar15 = local_94;
          }
          while( true ) {
            uVar8 = uVar8 + 1;
            uVar4 = (uint)uVar6;
            if (iVar15 == 0) break;
            uVar11 = (uint)local_80 >> ((byte)uVar8 & 0x1f);
            uVar12 = (uint)local_78 >> ((byte)uVar8 & 0x1f);
            uVar6 = (ulong)(uVar4 + (uVar12 + (uVar12 == 0)) * local_9c * (uVar11 + (uVar11 == 0)));
            iVar15 = iVar15 + -1;
          }
        }
        local_40 = (ulong)uVar4;
        local_5c = flags;
        __ptr = malloc(local_40);
        tex_ID = (uint)local_90;
        if ((uint)local_90 == 0) {
          glGenTextures(1,&tex_ID);
        }
        local_60 = uVar17;
        glBindTexture(uVar17,tex_ID);
        local_58 = (int)uVar10 + 1;
        local_50 = (ulong)uVar2;
        iVar15 = 0;
        if (0 < local_94) {
          iVar15 = local_94;
        }
        local_90 = (ulong)(uint)-iVar15;
        uVar8 = 0x80;
        local_48 = uVar10;
        for (; uVar6 = local_40, uVar3 <= (uint)uVar10; uVar3 = uVar3 + 1) {
          uVar11 = uVar8 + (int)local_40;
          if (uVar13 < uVar11) {
            glDeleteTextures(1,&tex_ID);
            tex_ID = 0;
            result_string_pointer = "DDS file was too small for expected image data";
            uVar3 = local_58;
          }
          else {
            local_54 = uVar11;
            memcpy(__ptr,local_38 + uVar8,local_40);
            uVar16 = local_70;
            if (local_98 == 0) {
              for (uVar7 = 0; uVar7 < uVar6; uVar7 = uVar7 + local_50) {
                uVar1 = *(undefined1 *)((long)__ptr + uVar7);
                *(undefined1 *)((long)__ptr + uVar7) = *(undefined1 *)((long)__ptr + uVar7 + 2);
                *(undefined1 *)((long)__ptr + uVar7 + 2) = uVar1;
              }
              glTexImage2D(uVar3,0,local_88,local_80,local_78,0,local_88,0x1401,__ptr);
            }
            else {
              (*soilGlCompressedTexImage2D)
                        (uVar3,0,(GLenum)local_88,(GLsizei)local_80,(GLsizei)local_78,0,
                         (GLsizei)local_70,__ptr);
            }
            uVar16 = uVar16 & 0xffffffff;
            for (iVar15 = 1; (int)local_90 + iVar15 != 1; iVar15 = iVar15 + 1) {
              uVar8 = (uint)local_80 >> ((byte)iVar15 & 0x1f);
              uVar13 = (uint)local_78 >> ((byte)iVar15 & 0x1f);
              if ((int)uVar8 < 2) {
                uVar8 = 1;
              }
              if ((int)uVar13 < 2) {
                uVar13 = 1;
              }
              if (local_98 == 0) {
                iVar9 = uVar13 * local_9c * uVar8;
                glTexImage2D(uVar3,iVar15,local_88,uVar8,uVar13,0,local_88,0x1401,
                             uVar16 + (long)__ptr);
              }
              else {
                iVar9 = (uVar13 + 3 >> 2) * local_9c * (uVar8 + 3 >> 2);
                (*soilGlCompressedTexImage2D)
                          (uVar3,iVar15,(GLenum)local_88,uVar8,uVar13,0,iVar9,
                           (GLvoid *)(uVar16 + (long)__ptr));
              }
              uVar16 = (ulong)(uint)((int)uVar16 + iVar9);
            }
            result_string_pointer = "DDS file loaded";
            uVar10 = local_48;
            uVar13 = local_64;
            uVar8 = local_54;
          }
        }
        free(__ptr);
        uVar8 = local_5c;
        uVar17 = local_60;
        if (tex_ID != 0) {
          glTexParameteri(local_60,0x2800,0x2601);
          uVar10 = 0x2703;
          if (local_94 < 1) {
            uVar10 = 0x2601;
          }
          glTexParameteri(uVar17,0x2801,uVar10);
          iVar15 = 0x2901 - (uint)((uVar8 & 4) == 0);
          glTexParameteri(uVar17,0x2802,iVar15);
          glTexParameteri(uVar17,0x2803,iVar15);
          glTexParameteri(uVar17,0x8072,iVar15);
          return tex_ID;
        }
        return 0;
      }
      result_string_pointer = "DDS image was not a cubemap";
    }
    else if (loading_as_cubemap == 0) {
      result_string_pointer = "DDS image was a cubemap";
    }
    else {
      iVar15 = query_cubemap_capability();
      if (iVar15 == 1) {
        uVar10 = 0x851a;
        uVar3 = 0x8515;
        uVar17 = 0x8513;
        goto LAB_00156bc8;
      }
      result_string_pointer = "Direct upload of cubemap images not supported by the OpenGL driver";
    }
  }
  return 0;
}

Assistant:

unsigned int SOIL_direct_load_DDS_from_memory(
		const unsigned char *const buffer,
		int buffer_length,
		unsigned int reuse_texture_ID,
		int flags,
		int loading_as_cubemap )
{
	/*	variables	*/
	DDS_header header;
	unsigned int buffer_index = 0;
	unsigned int tex_ID = 0;
	/*	file reading variables	*/
	unsigned int S3TC_type = 0;
	unsigned char *DDS_data;
	unsigned int DDS_main_size;
	unsigned int DDS_full_size;
	unsigned int width, height;
	int mipmaps, cubemap, uncompressed, block_size = 16;
	unsigned int flag;
	unsigned int cf_target, ogl_target_start, ogl_target_end;
	unsigned int opengl_texture_type;
	int i;
	/*	1st off, does the filename even exist?	*/
	if( NULL == buffer )
	{
		/*	we can't do it!	*/
		result_string_pointer = "NULL buffer";
		return 0;
	}
	if( buffer_length < sizeof( DDS_header ) )
	{
		/*	we can't do it!	*/
		result_string_pointer = "DDS file was too small to contain the DDS header";
		return 0;
	}
	/*	try reading in the header	*/
	memcpy ( (void*)(&header), (const void *)buffer, sizeof( DDS_header ) );
	buffer_index = sizeof( DDS_header );
	/*	guilty until proven innocent	*/
	result_string_pointer = "Failed to read a known DDS header";
	/*	validate the header (warning, "goto"'s ahead, shield your eyes!!)	*/
	flag = ('D'<<0)|('D'<<8)|('S'<<16)|(' '<<24);
	if( header.dwMagic != flag ) {goto quick_exit;}
	if( header.dwSize != 124 ) {goto quick_exit;}
	/*	I need all of these	*/
	flag = DDSD_CAPS | DDSD_HEIGHT | DDSD_WIDTH | DDSD_PIXELFORMAT;
	if( (header.dwFlags & flag) != flag ) {goto quick_exit;}
	/*	According to the MSDN spec, the dwFlags should contain
		DDSD_LINEARSIZE if it's compressed, or DDSD_PITCH if
		uncompressed.  Some DDS writers do not conform to the
		spec, so I need to make my reader more tolerant	*/
	/*	I need one of these	*/
	flag = DDPF_FOURCC | DDPF_RGB;
	if( (header.sPixelFormat.dwFlags & flag) == 0 ) {goto quick_exit;}
	if( header.sPixelFormat.dwSize != 32 ) {goto quick_exit;}
	if( (header.sCaps.dwCaps1 & DDSCAPS_TEXTURE) == 0 ) {goto quick_exit;}
	/*	make sure it is a type we can upload	*/
	if( (header.sPixelFormat.dwFlags & DDPF_FOURCC) &&
		!(
		(header.sPixelFormat.dwFourCC == (('D'<<0)|('X'<<8)|('T'<<16)|('1'<<24))) ||
		(header.sPixelFormat.dwFourCC == (('D'<<0)|('X'<<8)|('T'<<16)|('3'<<24))) ||
		(header.sPixelFormat.dwFourCC == (('D'<<0)|('X'<<8)|('T'<<16)|('5'<<24)))
		) )
	{
		goto quick_exit;
	}
	/*	OK, validated the header, let's load the image data	*/
	result_string_pointer = "DDS header loaded and validated";
	width = header.dwWidth;
	height = header.dwHeight;
	uncompressed = 1 - (header.sPixelFormat.dwFlags & DDPF_FOURCC) / DDPF_FOURCC;
	cubemap = (header.sCaps.dwCaps2 & DDSCAPS2_CUBEMAP) / DDSCAPS2_CUBEMAP;
	if( uncompressed )
	{
		S3TC_type = GL_RGB;
		block_size = 3;
		if( header.sPixelFormat.dwFlags & DDPF_ALPHAPIXELS )
		{
			S3TC_type = GL_RGBA;
			block_size = 4;
		}
		DDS_main_size = width * height * block_size;
	} else
	{
		/*	can we even handle direct uploading to OpenGL DXT compressed images?	*/
		if( query_DXT_capability() != SOIL_CAPABILITY_PRESENT )
		{
			/*	we can't do it!	*/
			result_string_pointer = "Direct upload of S3TC images not supported by the OpenGL driver";
			return 0;
		}
		/*	well, we know it is DXT1/3/5, because we checked above	*/
		switch( (header.sPixelFormat.dwFourCC >> 24) - '0' )
		{
		case 1:
			S3TC_type = SOIL_RGBA_S3TC_DXT1;
			block_size = 8;
			break;
		case 3:
			S3TC_type = SOIL_RGBA_S3TC_DXT3;
			block_size = 16;
			break;
		case 5:
			S3TC_type = SOIL_RGBA_S3TC_DXT5;
			block_size = 16;
			break;
		}
		DDS_main_size = ((width+3)>>2)*((height+3)>>2)*block_size;
	}
	if( cubemap )
	{
		/* does the user want a cubemap?	*/
		if( !loading_as_cubemap )
		{
			/*	we can't do it!	*/
			result_string_pointer = "DDS image was a cubemap";
			return 0;
		}
		/*	can we even handle cubemaps with the OpenGL driver?	*/
		if( query_cubemap_capability() != SOIL_CAPABILITY_PRESENT )
		{
			/*	we can't do it!	*/
			result_string_pointer = "Direct upload of cubemap images not supported by the OpenGL driver";
			return 0;
		}
		ogl_target_start = SOIL_TEXTURE_CUBE_MAP_POSITIVE_X;
		ogl_target_end =   SOIL_TEXTURE_CUBE_MAP_NEGATIVE_Z;
		opengl_texture_type = SOIL_TEXTURE_CUBE_MAP;
	} else
	{
		/* does the user want a non-cubemap?	*/
		if( loading_as_cubemap )
		{
			/*	we can't do it!	*/
			result_string_pointer = "DDS image was not a cubemap";
			return 0;
		}
		ogl_target_start = GL_TEXTURE_2D;
		ogl_target_end =   GL_TEXTURE_2D;
		opengl_texture_type = GL_TEXTURE_2D;
	}
	if( (header.sCaps.dwCaps1 & DDSCAPS_MIPMAP) && (header.dwMipMapCount > 1) )
	{
		int shift_offset;
		mipmaps = header.dwMipMapCount - 1;
		DDS_full_size = DDS_main_size;
		if( uncompressed )
		{
			/*	uncompressed DDS, simple MIPmap size calculation	*/
			shift_offset = 0;
		} else
		{
			/*	compressed DDS, MIPmap size calculation is block based	*/
			shift_offset = 2;
		}
		for( i = 1; i <= mipmaps; ++ i )
		{
			int w, h;
			w = width >> (shift_offset + i);
			h = height >> (shift_offset + i);
			if( w < 1 )
			{
				w = 1;
			}
			if( h < 1 )
			{
				h = 1;
			}
			DDS_full_size += w*h*block_size;
		}
	} else
	{
		mipmaps = 0;
		DDS_full_size = DDS_main_size;
	}
	DDS_data = (unsigned char*)malloc( DDS_full_size );
	/*	got the image data RAM, create or use an existing OpenGL texture handle	*/
	tex_ID = reuse_texture_ID;
	if( tex_ID == 0 )
	{
		glGenTextures( 1, &tex_ID );
	}
	/*  bind an OpenGL texture ID	*/
	glBindTexture( opengl_texture_type, tex_ID );
	/*	do this for each face of the cubemap!	*/
	for( cf_target = ogl_target_start; cf_target <= ogl_target_end; ++cf_target )
	{
		if( buffer_index + DDS_full_size <= buffer_length )
		{
			unsigned int byte_offset = DDS_main_size;
			memcpy( (void*)DDS_data, (const void*)(&buffer[buffer_index]), DDS_full_size );
			buffer_index += DDS_full_size;
			/*	upload the main chunk	*/
			if( uncompressed )
			{
				/*	and remember, DXT uncompressed uses BGR(A),
					so swap to RGB(A) for ALL MIPmap levels	*/
				for( i = 0; i < DDS_full_size; i += block_size )
				{
					unsigned char temp = DDS_data[i];
					DDS_data[i] = DDS_data[i+2];
					DDS_data[i+2] = temp;
				}
				glTexImage2D(
					cf_target, 0,
					S3TC_type, width, height, 0,
					S3TC_type, GL_UNSIGNED_BYTE, DDS_data );
			} else
			{
				soilGlCompressedTexImage2D(
					cf_target, 0,
					S3TC_type, width, height, 0,
					DDS_main_size, DDS_data );
			}
			/*	upload the mipmaps, if we have them	*/
			for( i = 1; i <= mipmaps; ++i )
			{
				int w, h, mip_size;
				w = width >> i;
				h = height >> i;
				if( w < 1 )
				{
					w = 1;
				}
				if( h < 1 )
				{
					h = 1;
				}
				/*	upload this mipmap	*/
				if( uncompressed )
				{
					mip_size = w*h*block_size;
					glTexImage2D(
						cf_target, i,
						S3TC_type, w, h, 0,
						S3TC_type, GL_UNSIGNED_BYTE, &DDS_data[byte_offset] );
				} else
				{
					mip_size = ((w+3)/4)*((h+3)/4)*block_size;
					soilGlCompressedTexImage2D(
						cf_target, i,
						S3TC_type, w, h, 0,
						mip_size, &DDS_data[byte_offset] );
				}
				/*	and move to the next mipmap	*/
				byte_offset += mip_size;
			}
			/*	it worked!	*/
			result_string_pointer = "DDS file loaded";
		} else
		{
			glDeleteTextures( 1, & tex_ID );
			tex_ID = 0;
			cf_target = ogl_target_end + 1;
			result_string_pointer = "DDS file was too small for expected image data";
		}
	}/* end reading each face */
	SOIL_free_image_data( DDS_data );
	if( tex_ID )
	{
		/*	did I have MIPmaps?	*/
		if( mipmaps > 0 )
		{
			/*	instruct OpenGL to use the MIPmaps	*/
			glTexParameteri( opengl_texture_type, GL_TEXTURE_MAG_FILTER, GL_LINEAR );
			glTexParameteri( opengl_texture_type, GL_TEXTURE_MIN_FILTER, GL_LINEAR_MIPMAP_LINEAR );
		} else
		{
			/*	instruct OpenGL _NOT_ to use the MIPmaps	*/
			glTexParameteri( opengl_texture_type, GL_TEXTURE_MAG_FILTER, GL_LINEAR );
			glTexParameteri( opengl_texture_type, GL_TEXTURE_MIN_FILTER, GL_LINEAR );
		}
		/*	does the user want clamping, or wrapping?	*/
		if( flags & SOIL_FLAG_TEXTURE_REPEATS )
		{
			glTexParameteri( opengl_texture_type, GL_TEXTURE_WRAP_S, GL_REPEAT );
			glTexParameteri( opengl_texture_type, GL_TEXTURE_WRAP_T, GL_REPEAT );
			glTexParameteri( opengl_texture_type, SOIL_TEXTURE_WRAP_R, GL_REPEAT );
		} else
		{
			/*	unsigned int clamp_mode = SOIL_CLAMP_TO_EDGE;	*/
			unsigned int clamp_mode = GL_CLAMP;
			glTexParameteri( opengl_texture_type, GL_TEXTURE_WRAP_S, clamp_mode );
			glTexParameteri( opengl_texture_type, GL_TEXTURE_WRAP_T, clamp_mode );
			glTexParameteri( opengl_texture_type, SOIL_TEXTURE_WRAP_R, clamp_mode );
		}
	}

quick_exit:
	/*	report success or failure	*/
	return tex_ID;
}